

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

bool Js::DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining
               (DynamicTypeHandler *oldTypeHandler,DynamicTypeHandler *newTypeHandler)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 uVar4;
  PropertyIndex PVar5;
  undefined4 *puVar6;
  bool local_21;
  bool local_19;
  DynamicTypeHandler *newTypeHandler_local;
  DynamicTypeHandler *oldTypeHandler_local;
  
  if (oldTypeHandler == (DynamicTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x232,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (newTypeHandler == (DynamicTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x233,"(newTypeHandler)","newTypeHandler");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(oldTypeHandler);
  uVar4 = DynamicTypeHandler::GetInlineSlotCapacity(newTypeHandler);
  local_19 = true;
  if (uVar3 != uVar4) {
    bVar2 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(oldTypeHandler);
    local_21 = false;
    if (bVar2) {
      uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(newTypeHandler);
      uVar4 = DynamicTypeHandler::GetInlineSlotCapacity(oldTypeHandler);
      PVar5 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      local_21 = (uint)uVar3 == (uint)uVar4 - (uint)PVar5;
    }
    local_19 = local_21;
  }
  return local_19;
}

Assistant:

bool DynamicObject::IsTypeHandlerCompatibleForObjectHeaderInlining(DynamicTypeHandler * oldTypeHandler, DynamicTypeHandler * newTypeHandler)
    {
        Assert(oldTypeHandler);
        Assert(newTypeHandler);

        return
            oldTypeHandler->GetInlineSlotCapacity() == newTypeHandler->GetInlineSlotCapacity() ||
            (
                oldTypeHandler->IsObjectHeaderInlinedTypeHandler() &&
                newTypeHandler->GetInlineSlotCapacity() ==
                    oldTypeHandler->GetInlineSlotCapacity() - DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
            );
    }